

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screrror.cpp
# Opt level: O2

HRESULT __thiscall
CompileScriptException::ProcessError
          (CompileScriptException *this,IScanner *pScan,HRESULT hr,ParseNode *pnodeBase,
          LPCWSTR stringOne,LPCWSTR stringTwo)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  BSTR pWVar5;
  size_t sVar6;
  undefined4 *puVar7;
  WCHAR local_138 [4];
  OLECHAR szT [128];
  
  szT._248_8_ = pnodeBase;
  Free(this);
  uVar3 = MapHr(hr,(ErrorTypeEnum *)0x0);
  (this->super_ScriptException).ei.scode = uVar3;
  if ((uVar3 & 0x1fff0000) == 0xa0000) {
    pWVar5 = BstrGetResourceString(uVar3 & 0xffff);
    (this->super_ScriptException).ei.bstrDescription = pWVar5;
    if (pWVar5 != (BSTR)0x0) {
      sVar6 = PAL_wcslen(stringOne);
      if (sVar6 != 0) {
        _snwprintf_unsafe(local_138,0x80,0x7f,(this->super_ScriptException).ei.bstrDescription,
                          stringOne,stringTwo);
        SysFreeString((this->super_ScriptException).ei.bstrDescription);
        pWVar5 = SysAllocString(local_138);
        (this->super_ScriptException).ei.bstrDescription = pWVar5;
      }
      goto LAB_00d5aa88;
    }
    uVar3 = (this->super_ScriptException).ei.scode;
  }
  _snwprintf_unsafe(local_138,0x32,0x31,L"error %d",(ulong)uVar3);
  pWVar5 = SysAllocString(local_138);
  (this->super_ScriptException).ei.bstrDescription = pWVar5;
  if (pWVar5 == (BSTR)0x0) {
    (this->super_ScriptException).ei.scode = -0x7ff8fff2;
  }
LAB_00d5aa88:
  pWVar5 = BstrGetResourceString(0x1000);
  (this->super_ScriptException).ei.bstrSource = pWVar5;
  if (pScan == (IScanner *)0x0 || szT._248_8_ != 0) {
    iVar4 = -0x7999bffc;
    if ((((1 < hr + 0x7fffbffcU) && (hr != -0x7ff8fff2)) && (hr != -0x7ff5ffe4)) &&
       (((hr != -0x7ff5fc17 && (hr != -0x7ff5ebe4)) && (hr != -0x7ff5e4a8)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/screrror.cpp"
                         ,0x12d,
                         "(hr == WASMERR_WasmCompileError || hr == JSERR_AsmJsCompileError || hr == ERRnoMemory || hr == VBSERR_OutOfStack || hr == ((HRESULT)0x8007000EL) || hr == ((HRESULT)0x80004005L) || hr == ((HRESULT)0x80004004L))"
                         ,
                         "hr == WASMERR_WasmCompileError || hr == JSERR_AsmJsCompileError || hr == ERRnoMemory || hr == VBSERR_OutOfStack || hr == E_OUTOFMEMORY || hr == E_FAIL || hr == E_ABORT"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
  }
  else {
    this->hasLineNumberInfo = true;
    (**pScan->_vptr_IScanner)
              (pScan,this,&(this->super_ScriptException).ichLim,&this->line,&this->ichMinLine);
    iVar4 = (*pScan->_vptr_IScanner[1])(pScan,(ulong)(uint)this->ichMinLine,&this->bstrLine);
    if (-1 < iVar4) {
      iVar4 = -0x7999bffc;
      if ((this->super_ScriptException).ichMin < this->ichMinLine) {
        (this->super_ScriptException).ichMin = this->ichMinLine;
      }
    }
  }
  return iVar4;
}

Assistant:

HRESULT  CompileScriptException::ProcessError(IScanner * pScan, HRESULT hr, ParseNode * pnodeBase, LPCWSTR stringOne, LPCWSTR stringTwo)
{
    // fill in the ScriptException structure
    Free();
    ei.scode = GetScode(MapHr(hr));

    // get the error string
    if (FACILITY_CONTROL != HRESULT_FACILITY(ei.scode) ||
        nullptr == (ei.bstrDescription =
        BstrGetResourceString(HRESULT_CODE(ei.scode))))
    {
        OLECHAR szT[50];
        _snwprintf_s(szT, ARRAYSIZE(szT), ARRAYSIZE(szT)-1, _u("error %d"), ei.scode);
        if (nullptr == (ei.bstrDescription = SysAllocString(szT)))
            ei.scode = E_OUTOFMEMORY;
    }
    else if (wcslen(stringOne) > 0)
    {
        OLECHAR szT[128];
        _snwprintf_s(szT, ARRAYSIZE(szT), ARRAYSIZE(szT)-1, ei.bstrDescription, stringOne, stringTwo);
        SysFreeString(ei.bstrDescription);
        ei.bstrDescription = SysAllocString(szT);
    }

    ei.bstrSource = BstrGetResourceString(IDS_COMPILATION_ERROR_SOURCE);
    if (nullptr == pnodeBase && nullptr != pScan)
    {
        // parsing phase - get the line number from the scanner
        Assert(pScan);
        this->hasLineNumberInfo = true;
        pScan->GetErrorLineInfo(this->ichMin, this->ichLim, this->line, this->ichMinLine);

        HRESULT hrSysAlloc = pScan->SysAllocErrorLine(this->ichMinLine, &this->bstrLine);
        if( FAILED(hrSysAlloc) )
        {
            return hrSysAlloc;
        }

        if (ichMin < ichMinLine)
            ichMin = ichMinLine;
    }
    else
    {
        // TODO: Variable length registers.
        // Remove E_FAIL once we have this feature.
        // error during code gen - no line number info available
        // E_ABORT may result if compilation does stack probe while thread is in disabled state.
        Assert(hr == WASMERR_WasmCompileError || hr == JSERR_AsmJsCompileError || hr == ERRnoMemory || hr == VBSERR_OutOfStack || hr == E_OUTOFMEMORY || hr == E_FAIL || hr == E_ABORT);
    }
    return SCRIPT_E_RECORDED;
}